

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# klibexec.h
# Opt level: O0

void kObjectProto_SetObject(KonohaContext *kctx,void *ao,ksymbol_t key,ktypeattr_t ty,void *val)

{
  uint uVar1;
  KProtoMap *pKVar2;
  uint in_ECX;
  undefined4 in_EDX;
  long in_RSI;
  long in_RDI;
  KonohaContext *in_R8;
  KDict *dict;
  KKeyValue kvs;
  kObjectVar *o;
  KonohaContext *in_stack_ffffffffffffffc0;
  
  uVar1 = in_ECX | 0x80000000;
  if (*(long *)(in_RSI + 0x10) == 0) {
    pKVar2 = new_KProtoMap(in_stack_ffffffffffffffc0);
    *(KProtoMap **)(in_RSI + 0x10) = pKVar2;
  }
  KDict_Set(in_R8,(KDict *)CONCAT44(uVar1,in_EDX),(KKeyValue *)(*(long *)(in_RSI + 0x10) + 0x10));
  (**(code **)(*(long *)(in_RDI + 0x10) + 0x238))(in_RDI,in_RSI);
  return;
}

Assistant:

static void kObjectProto_SetObject(KonohaContext *kctx, kAbstractObject *ao, ksymbol_t key, ktypeattr_t ty, kAbstractObject *val)
{
	kObjectVar *o = (kObjectVar *)ao;
	KKeyValue kvs = {key, ty | KTypeAttr_Boxed, {(uintptr_t)val}};
	if(KGetProtoMap(o) == NULL) {
		KSetProtoMap(o, new_KProtoMap(kctx));
	}
	KDict *dict = &(KGetProtoMap(o)->dict);
	KDict_Set(kctx, dict, &kvs);
	PLATAPI GCModule.WriteBarrier(kctx, o);
}